

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  uint local_28;
  OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  RegSlot R2_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_28 = R2;
  layout = (OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                    ((uchar *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),R1);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)0>::Assign<unsigned_char,unsigned_int>
                        ((uchar *)((long)&offsetOfRelativeJumpOffsetFromEnd + 7),local_28), bVar1))
  {
    offsetOfRelativeJumpOffsetFromEnd._4_2_ = 4;
    Data::EncodeT<(Js::LayoutSize)0>
              (&this->m_byteCodeData,op,(void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),4,
               this);
    AddJumpOffset(this,op,labelID,4);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg2(OpCode op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_BrReg2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }